

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevc_inter_pred_filters.c
# Opt level: O0

void ihevc_inter_pred_luma_copy_w16out
               (UWORD8 *pu1_src,WORD16 *pi2_dst,WORD32 src_strd,WORD32 dst_strd,WORD8 *pi1_coeff,
               WORD32 ht,WORD32 wd)

{
  WORD32 col;
  WORD32 row;
  WORD32 ht_local;
  WORD8 *pi1_coeff_local;
  WORD32 dst_strd_local;
  WORD32 src_strd_local;
  WORD16 *pi2_dst_local;
  UWORD8 *pu1_src_local;
  
  pi2_dst_local = pi2_dst;
  pu1_src_local = pu1_src;
  for (row = 0; row < ht; row = row + 1) {
    for (col = 0; col < wd; col = col + 1) {
      pi2_dst_local[col] = (ushort)pu1_src_local[col] << 6;
    }
    pu1_src_local = pu1_src_local + src_strd;
    pi2_dst_local = pi2_dst_local + dst_strd;
  }
  return;
}

Assistant:

void ihevc_inter_pred_luma_copy_w16out(UWORD8 *pu1_src,
                                       WORD16 *pi2_dst,
                                       WORD32 src_strd,
                                       WORD32 dst_strd,
                                       WORD8 *pi1_coeff,
                                       WORD32 ht,
                                       WORD32 wd)
{
    WORD32 row, col;
    UNUSED(pi1_coeff);
    for(row = 0; row < ht; row++)
    {
        for(col = 0; col < wd; col++)
        {
            pi2_dst[col] = (pu1_src[col] << SHIFT_14_MINUS_BIT_DEPTH);
        }

        pu1_src += src_strd;
        pi2_dst += dst_strd;
    }

}